

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

loader_impl loader_impl_create_host(char *tag)

{
  loader_impl impl;
  char *in_stack_ffffffffffffffe8;
  loader_impl local_8;
  
  local_8 = loader_impl_allocate(in_stack_ffffffffffffffe8);
  if (local_8 == (loader_impl)0x0) {
    local_8 = (loader_impl)0x0;
  }
  else {
    local_8->init = 0;
    local_8->options = (value)0x0;
  }
  return local_8;
}

Assistant:

loader_impl loader_impl_create_host(const loader_tag tag)
{
	loader_impl impl = loader_impl_allocate(tag);

	if (impl == NULL)
	{
		return NULL;
	}

	impl->init = 0; /* Do not call singleton initialize */
	impl->options = NULL;

	return impl;
}